

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# memory_allocator.c
# Opt level: O0

memory_allocator memory_allocator_create(memory_allocator_iface iface,void *ctx)

{
  memory_allocator_impl pvVar1;
  void *in_RSI;
  memory_allocator_iface in_RDI;
  memory_allocator_impl impl;
  memory_allocator allocator;
  memory_allocator local_8;
  
  pvVar1 = (*in_RDI->create)(in_RSI);
  if (pvVar1 == (memory_allocator_impl)0x0) {
    local_8 = (memory_allocator)0x0;
  }
  else {
    local_8 = (memory_allocator)(*in_RDI->allocate)(pvVar1,0x38);
    if (local_8 == (memory_allocator)0x0) {
      (*in_RDI->destroy)(pvVar1);
      local_8 = (memory_allocator)0x0;
    }
    else {
      local_8->iface = in_RDI;
      local_8->impl = pvVar1;
      (local_8->size).alloc = 0;
      (local_8->size).bad_alloc = 0;
      (local_8->size).realloc = 0;
      (local_8->size).bad_realloc = 0;
      (local_8->size).dealloc = 0;
    }
  }
  return local_8;
}

Assistant:

memory_allocator memory_allocator_create(memory_allocator_iface iface, void *ctx)
{
	memory_allocator allocator;

	memory_allocator_impl impl = iface->create(ctx);

	if (impl == NULL)
	{
		return NULL;
	}

	allocator = iface->allocate(impl, sizeof(struct memory_allocator_type));

	if (allocator == NULL)
	{
		iface->destroy(impl);

		return NULL;
	}

	allocator->iface = iface;
	allocator->impl = impl;

	allocator->size.alloc = 0;
	allocator->size.bad_alloc = 0;
	allocator->size.realloc = 0;
	allocator->size.bad_realloc = 0;
	allocator->size.dealloc = 0;

	return allocator;
}